

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlattribute.cpp
# Opt level: O2

bool __thiscall libcellml::XmlAttribute::inNamespaceUri(XmlAttribute *this,char *ns)

{
  int iVar1;
  string local_30;
  
  namespaceUri_abi_cxx11_(&local_30,this);
  iVar1 = xmlStrcmp(local_30._M_dataplus._M_p,ns);
  std::__cxx11::string::~string((string *)&local_30);
  return iVar1 == 0;
}

Assistant:

bool XmlAttribute::inNamespaceUri(const char *ns) const
{
    return xmlStrcmp(reinterpret_cast<const xmlChar *>(namespaceUri().c_str()), reinterpret_cast<const xmlChar *>(ns)) == 0;
}